

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

istream * Json::operator>>(istream *sin,Value *root)

{
  string local_138;
  undefined1 local_101;
  undefined1 local_100 [7];
  bool ok;
  Reader reader;
  Value *root_local;
  istream *sin_local;
  
  reader.lastValue_ = root;
  Reader::Reader((Reader *)local_100);
  local_101 = Reader::parse((Reader *)local_100,sin,reader.lastValue_);
  if (!(bool)local_101) {
    Reader::getFormatedErrorMessages_abi_cxx11_(&local_138,(Reader *)local_100);
    jbcoin::Throw<std::runtime_error,std::__cxx11::string>(&local_138);
  }
  Reader::~Reader((Reader *)local_100);
  return sin;
}

Assistant:

std::istream& operator>> ( std::istream& sin, Value& root )
{
    Json::Reader reader;
    bool ok = reader.parse (sin, root);

    //JSON_ASSERT( ok );
    if (! ok)
        jbcoin::Throw<std::runtime_error> (reader.getFormatedErrorMessages ());

    return sin;
}